

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputICase3::Run(BasicInputICase3 *this)

{
  CallLogWrapper *this_00;
  IVec4 *pIVar1;
  long lVar2;
  GLuint i;
  GLuint index;
  int iVar3;
  bool bVar4;
  undefined8 local_34;
  undefined4 local_2c;
  
  this_00 = &(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  iVar3 = 8;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    glu::CallLogWrapper::glVertexAttribI4i(this_00,index,0,0,0,0);
    glu::CallLogWrapper::glVertexAttribI4ui(this_00,index | 8,0,0,0,0);
    index = index + 1;
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x18,(void *)0x0,0x88e4);
  local_34 = 0x200000001;
  local_2c = 3;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0xc,&local_34);
  local_34 = 0x500000004;
  local_2c = 6;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,0xc,&local_34);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  glu::CallLogWrapper::glVertexAttribIPointer(this_00,7,3,0x1404,0xc,(void *)0x0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,0,2,0x1404,4);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,7);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,7);
  (this->super_BasicInputIBase).expected_datai[0].m_data[0] = 2;
  (this->super_BasicInputIBase).expected_datai[0].m_data[1] = 3;
  (this->super_BasicInputIBase).expected_datai[0].m_data[2] = 0;
  (this->super_BasicInputIBase).expected_datai[0].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[7].m_data[0] = 1;
  (this->super_BasicInputIBase).expected_datai[7].m_data[1] = 2;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[7].m_data[2] = 3;
  pIVar1[7].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[8].m_data[0] = 5;
  (this->super_BasicInputIBase).expected_datai[8].m_data[1] = 6;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[8].m_data[2] = 0;
  pIVar1[8].m_data[3] = 1;
  (this->super_BasicInputIBase).expected_datai[0xf].m_data[0] = 4;
  (this->super_BasicInputIBase).expected_datai[0xf].m_data[1] = 5;
  pIVar1 = (this->super_BasicInputIBase).expected_datai;
  pIVar1[0xf].m_data[2] = 6;
  pIVar1[0xf].m_data[3] = 1;
  lVar2 = BasicInputIBase::Run(&this->super_BasicInputIBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribI4i(i, 0, 0, 0, 0);
			glVertexAttribI4ui(i + 8, 0, 0, 0, 0);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(IVec3) * 2, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(IVec3), &IVec3(1, 2, 3)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(IVec3), &IVec3(4, 5, 6)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribIPointer(7, 3, GL_INT, 12, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glVertexAttribIFormat(0, 2, GL_INT, 4);
		glVertexAttribBinding(0, 7);

		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(7);

		expected_datai[0]	 = IVec4(2, 3, 0, 1);
		expected_datai[7]	 = IVec4(1, 2, 3, 1);
		expected_datai[0 + 8] = IVec4(5, 6, 0, 1);
		expected_datai[7 + 8] = IVec4(4, 5, 6, 1);
		return BasicInputIBase::Run();
	}